

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O2

void ImGui_ImplSDL2_NewFrame(void)

{
  uint uVar1;
  int iVar2;
  ImGuiMouseCursor IVar3;
  int iVar4;
  int iVar5;
  ImGui_ImplSDL2_Data *pIVar6;
  ImGuiIO *pIVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  SDL_Window *pSVar11;
  Uint64 UVar12;
  undefined4 uVar13;
  SDL_Cursor *pSVar14;
  float fVar15;
  ImVec2 IVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int display_h;
  int display_w;
  int h;
  int w;
  int window_x;
  int local_3c;
  int mouse_x_global;
  int window_y;
  
  pIVar6 = ImGui_ImplSDL2_GetBackendData();
  pIVar7 = ImGui::GetIO();
  SDL_GetWindowSize(pIVar6->Window,&w,&h);
  uVar8 = SDL_GetWindowFlags(pIVar6->Window);
  if ((uVar8 & 0x40) != 0) {
    h = 0;
    w = 0;
  }
  if (pIVar6->Renderer == (SDL_Renderer *)0x0) {
    SDL_GL_GetDrawableSize(pIVar6->Window,&display_w,&display_h);
  }
  else {
    SDL_GetRendererOutputSize(pIVar6->Renderer,&display_w,&display_h);
  }
  IVar16.x = (float)w;
  IVar16.y = (float)h;
  auVar20._8_8_ = 0;
  auVar20._0_4_ = IVar16.x;
  auVar20._4_4_ = IVar16.y;
  pIVar7->DisplaySize = IVar16;
  if (0 < h && 0 < w) {
    auVar19._0_4_ = (float)display_w;
    auVar19._4_4_ = (float)display_h;
    auVar19._8_8_ = 0;
    auVar20 = divps(auVar19,auVar20);
    pIVar7->DisplayFramebufferScale = auVar20._0_8_;
  }
  if (ImGui_ImplSDL2_NewFrame()::frequency == '\0') {
    iVar4 = __cxa_guard_acquire(&ImGui_ImplSDL2_NewFrame()::frequency);
    if (iVar4 != 0) {
      ImGui_ImplSDL2_NewFrame::frequency = SDL_GetPerformanceFrequency();
      __cxa_guard_release(&ImGui_ImplSDL2_NewFrame()::frequency);
    }
  }
  uVar9 = SDL_GetPerformanceCounter();
  uVar8 = pIVar6->Time;
  UVar12 = uVar8 + 1;
  if (uVar8 < uVar9) {
    UVar12 = uVar9;
  }
  if (uVar8 == 0) {
    fVar15 = 0.016666668;
  }
  else {
    lVar10 = UVar12 - uVar8;
    auVar17._8_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar17._0_8_ = lVar10;
    auVar17._12_4_ = 0x45300000;
    auVar18._8_4_ = (int)(ImGui_ImplSDL2_NewFrame::frequency >> 0x20);
    auVar18._0_8_ = ImGui_ImplSDL2_NewFrame::frequency;
    auVar18._12_4_ = 0x45300000;
    fVar15 = (float)(((auVar17._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) /
                    ((auVar18._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)ImGui_ImplSDL2_NewFrame::frequency) -
                    4503599627370496.0)));
  }
  pIVar7->DeltaTime = fVar15;
  pIVar6->Time = UVar12;
  iVar4 = pIVar6->MouseLastLeaveFrame;
  if (iVar4 != 0) {
    iVar2 = ImGui::GetFrameCount();
    if ((iVar2 <= iVar4) && (pIVar6->MouseButtonsDown == 0)) {
      pIVar6->MouseWindowID = 0;
      pIVar6->MouseLastLeaveFrame = 0;
      ImGuiIO::AddMousePosEvent(pIVar7,-3.4028235e+38,-3.4028235e+38);
    }
  }
  pIVar6 = ImGui_ImplSDL2_GetBackendData();
  pIVar7 = ImGui::GetIO();
  SDL_CaptureMouse(pIVar6->MouseButtonsDown != 0);
  pSVar11 = (SDL_Window *)SDL_GetKeyboardFocus();
  if (pIVar6->Window == pSVar11) {
    if (pIVar7->WantSetMousePos == true) {
      SDL_WarpMouseInWindow(pIVar6->Window,(int)(pIVar7->MousePos).x,(int)(pIVar7->MousePos).y);
    }
    if ((pIVar6->MouseCanUseGlobalState == true) && (pIVar6->MouseButtonsDown == 0)) {
      SDL_GetGlobalMouseState(&mouse_x_global,&local_3c);
      SDL_GetWindowPosition(pIVar6->Window,&window_x,&window_y);
      ImGuiIO::AddMousePosEvent
                (pIVar7,(float)(mouse_x_global - window_x),(float)(local_3c - window_y));
    }
  }
  pIVar7 = ImGui::GetIO();
  if ((pIVar7->ConfigFlags & 0x20) == 0) {
    pIVar6 = ImGui_ImplSDL2_GetBackendData();
    IVar3 = ImGui::GetMouseCursor();
    uVar13 = 0;
    if ((IVar3 != -1) && (uVar13 = 0, pIVar7->MouseDrawCursor == false)) {
      pSVar14 = pIVar6->MouseCursors[IVar3];
      if (pSVar14 == (SDL_Cursor *)0x0) {
        pSVar14 = pIVar6->MouseCursors[0];
      }
      uVar13 = 1;
      if (pIVar6->MouseLastCursor != pSVar14) {
        SDL_SetCursor(pSVar14);
        pIVar6->MouseLastCursor = pSVar14;
      }
    }
    SDL_ShowCursor(uVar13);
  }
  pIVar6 = ImGui_ImplSDL2_GetBackendData();
  pIVar7 = ImGui::GetIO();
  if ((pIVar6->WantUpdateGamepadsList == true) &&
     (pIVar6->GamepadMode != ImGui_ImplSDL2_GamepadMode_Manual)) {
    ImGui_ImplSDL2_CloseGamepads();
    iVar4 = SDL_NumJoysticks();
    iVar2 = 0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (; iVar4 != iVar2; iVar2 = iVar2 + 1) {
      iVar5 = SDL_IsGameController(iVar2);
      if (iVar5 != 0) {
        _window_x = (_SDL_GameController *)SDL_GameControllerOpen(iVar2);
        if (_window_x != (_SDL_GameController *)0x0) {
          ImVector<_SDL_GameController_*>::push_back
                    (&pIVar6->Gamepads,(_SDL_GameController **)&window_x);
          if (pIVar6->GamepadMode == ImGui_ImplSDL2_GamepadMode_AutoFirst) break;
        }
      }
    }
    pIVar6->WantUpdateGamepadsList = false;
  }
  if ((pIVar7->ConfigFlags & 2) != 0) {
    uVar1 = pIVar7->BackendFlags;
    pIVar7->BackendFlags = uVar1 & 0xfffffffe;
    if ((pIVar6->Gamepads).Size != 0) {
      pIVar7->BackendFlags = uVar1 | 1;
      ImGui_ImplSDL2_UpdateGamepadButton
                (pIVar6,pIVar7,ImGuiKey_GamepadStart,SDL_CONTROLLER_BUTTON_START);
      ImGui_ImplSDL2_UpdateGamepadButton
                (pIVar6,pIVar7,ImGuiKey_GamepadBack,SDL_CONTROLLER_BUTTON_BACK);
      ImGui_ImplSDL2_UpdateGamepadButton
                (pIVar6,pIVar7,ImGuiKey_GamepadFaceLeft,SDL_CONTROLLER_BUTTON_X);
      ImGui_ImplSDL2_UpdateGamepadButton
                (pIVar6,pIVar7,ImGuiKey_GamepadFaceRight,SDL_CONTROLLER_BUTTON_B);
      ImGui_ImplSDL2_UpdateGamepadButton
                (pIVar6,pIVar7,ImGuiKey_GamepadFaceUp,SDL_CONTROLLER_BUTTON_Y);
      ImGui_ImplSDL2_UpdateGamepadButton
                (pIVar6,pIVar7,ImGuiKey_GamepadFaceDown,SDL_CONTROLLER_BUTTON_A);
      ImGui_ImplSDL2_UpdateGamepadButton
                (pIVar6,pIVar7,ImGuiKey_GamepadDpadLeft,SDL_CONTROLLER_BUTTON_DPAD_LEFT);
      ImGui_ImplSDL2_UpdateGamepadButton
                (pIVar6,pIVar7,ImGuiKey_GamepadDpadRight,SDL_CONTROLLER_BUTTON_DPAD_RIGHT);
      ImGui_ImplSDL2_UpdateGamepadButton
                (pIVar6,pIVar7,ImGuiKey_GamepadDpadUp,SDL_CONTROLLER_BUTTON_DPAD_UP);
      ImGui_ImplSDL2_UpdateGamepadButton
                (pIVar6,pIVar7,ImGuiKey_GamepadDpadDown,SDL_CONTROLLER_BUTTON_DPAD_DOWN);
      ImGui_ImplSDL2_UpdateGamepadButton
                (pIVar6,pIVar7,ImGuiKey_GamepadL1,SDL_CONTROLLER_BUTTON_LEFTSHOULDER);
      ImGui_ImplSDL2_UpdateGamepadButton
                (pIVar6,pIVar7,ImGuiKey_GamepadR1,SDL_CONTROLLER_BUTTON_RIGHTSHOULDER);
      ImGui_ImplSDL2_UpdateGamepadAnalog
                (pIVar6,pIVar7,ImGuiKey_GamepadL2,SDL_CONTROLLER_AXIS_TRIGGERLEFT,0.0,32767.0);
      ImGui_ImplSDL2_UpdateGamepadAnalog
                (pIVar6,pIVar7,ImGuiKey_GamepadR2,SDL_CONTROLLER_AXIS_TRIGGERRIGHT,0.0,32767.0);
      ImGui_ImplSDL2_UpdateGamepadButton
                (pIVar6,pIVar7,ImGuiKey_GamepadL3,SDL_CONTROLLER_BUTTON_LEFTSTICK);
      ImGui_ImplSDL2_UpdateGamepadButton
                (pIVar6,pIVar7,ImGuiKey_GamepadR3,SDL_CONTROLLER_BUTTON_RIGHTSTICK);
      ImGui_ImplSDL2_UpdateGamepadAnalog
                (pIVar6,pIVar7,ImGuiKey_GamepadLStickLeft,SDL_CONTROLLER_AXIS_LEFTX,-8000.0,-32768.0
                );
      ImGui_ImplSDL2_UpdateGamepadAnalog
                (pIVar6,pIVar7,ImGuiKey_GamepadLStickRight,SDL_CONTROLLER_AXIS_LEFTX,8000.0,32767.0)
      ;
      ImGui_ImplSDL2_UpdateGamepadAnalog
                (pIVar6,pIVar7,ImGuiKey_GamepadLStickUp,SDL_CONTROLLER_AXIS_LEFTY,-8000.0,-32768.0);
      ImGui_ImplSDL2_UpdateGamepadAnalog
                (pIVar6,pIVar7,ImGuiKey_GamepadLStickDown,SDL_CONTROLLER_AXIS_LEFTY,8000.0,32767.0);
      ImGui_ImplSDL2_UpdateGamepadAnalog
                (pIVar6,pIVar7,ImGuiKey_GamepadRStickLeft,SDL_CONTROLLER_AXIS_RIGHTX,-8000.0,
                 -32768.0);
      ImGui_ImplSDL2_UpdateGamepadAnalog
                (pIVar6,pIVar7,ImGuiKey_GamepadRStickRight,SDL_CONTROLLER_AXIS_RIGHTX,8000.0,32767.0
                );
      ImGui_ImplSDL2_UpdateGamepadAnalog
                (pIVar6,pIVar7,ImGuiKey_GamepadRStickUp,SDL_CONTROLLER_AXIS_RIGHTY,-8000.0,-32768.0)
      ;
      ImGui_ImplSDL2_UpdateGamepadAnalog
                (pIVar6,pIVar7,ImGuiKey_GamepadRStickDown,SDL_CONTROLLER_AXIS_RIGHTY,8000.0,32767.0)
      ;
    }
  }
  return;
}

Assistant:

void ImGui_ImplSDL2_NewFrame()
{
    ImGui_ImplSDL2_Data* bd = ImGui_ImplSDL2_GetBackendData();
    IM_ASSERT(bd != nullptr && "Context or backend not initialized! Did you call ImGui_ImplSDL2_Init()?");
    ImGuiIO& io = ImGui::GetIO();

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    SDL_GetWindowSize(bd->Window, &w, &h);
    if (SDL_GetWindowFlags(bd->Window) & SDL_WINDOW_MINIMIZED)
        w = h = 0;
    if (bd->Renderer != nullptr)
        SDL_GetRendererOutputSize(bd->Renderer, &display_w, &display_h);
    else
        SDL_GL_GetDrawableSize(bd->Window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    if (w > 0 && h > 0)
        io.DisplayFramebufferScale = ImVec2((float)display_w / w, (float)display_h / h);

    // Setup time step (we don't use SDL_GetTicks() because it is using millisecond resolution)
    // (Accept SDL_GetPerformanceCounter() not returning a monotonically increasing value. Happens in VMs and Emscripten, see #6189, #6114, #3644)
    static Uint64 frequency = SDL_GetPerformanceFrequency();
    Uint64 current_time = SDL_GetPerformanceCounter();
    if (current_time <= bd->Time)
        current_time = bd->Time + 1;
    io.DeltaTime = bd->Time > 0 ? (float)((double)(current_time - bd->Time) / frequency) : (float)(1.0f / 60.0f);
    bd->Time = current_time;

    if (bd->MouseLastLeaveFrame && bd->MouseLastLeaveFrame >= ImGui::GetFrameCount() && bd->MouseButtonsDown == 0)
    {
        bd->MouseWindowID = 0;
        bd->MouseLastLeaveFrame = 0;
        io.AddMousePosEvent(-FLT_MAX, -FLT_MAX);
    }

    ImGui_ImplSDL2_UpdateMouseData();
    ImGui_ImplSDL2_UpdateMouseCursor();

    // Update game controllers (if enabled and available)
    ImGui_ImplSDL2_UpdateGamepads();
}